

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utLimitBoneWeights.cpp
# Opt level: O0

void __thiscall
LimitBoneWeightsTest_testProcess_Test::TestBody(LimitBoneWeightsTest_testProcess_Test *this)

{
  aiBone *paVar1;
  aiVertexWeight aVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  char *pcVar8;
  reference pWVar9;
  vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
  *this_00;
  vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
  *pvVar10;
  ulong uVar11;
  vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
  *local_110;
  AssertHelper local_f0;
  Message local_e8;
  float local_dc;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_2;
  Message local_c0;
  float local_b4;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  __normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
  local_98;
  __normal_iterator<const_Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
  local_90;
  const_iterator iter;
  float fSum;
  Message local_78 [3];
  uint local_5c;
  size_type local_58;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  uint i_2;
  float fStack_30;
  aiVertexWeight weight;
  uint q;
  aiBone *pcBone;
  uint i_1;
  uint i;
  VertexWeightList *asWeights;
  LimitBoneWeightsTest_testProcess_Test *this_local;
  
  Assimp::LimitBoneWeightsProcess::ProcessMesh
            ((this->super_LimitBoneWeightsTest).mProcess,(this->super_LimitBoneWeightsTest).mMesh);
  uVar5 = CONCAT44(0,((this->super_LimitBoneWeightsTest).mMesh)->mNumVertices);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar5;
  uVar6 = SUB168(auVar3 * ZEXT816(0x18),0);
  uVar11 = uVar6 + 8;
  if (SUB168(auVar3 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar6) {
    uVar11 = 0xffffffffffffffff;
  }
  puVar7 = (ulong *)operator_new__(uVar11);
  *puVar7 = uVar5;
  pvVar10 = (vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
             *)(puVar7 + 1);
  if (uVar5 != 0) {
    local_110 = pvVar10;
    do {
      std::
      vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
      ::vector(local_110);
      local_110 = local_110 + 1;
    } while (local_110 != pvVar10 + uVar5);
  }
  for (pcBone._4_4_ = 0; pcBone._4_4_ < ((this->super_LimitBoneWeightsTest).mMesh)->mNumVertices;
      pcBone._4_4_ = pcBone._4_4_ + 1) {
    std::
    vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
    ::reserve(pvVar10 + pcBone._4_4_,4);
  }
  for (pcBone._0_4_ = 0; (uint)pcBone < ((this->super_LimitBoneWeightsTest).mMesh)->mNumBones;
      pcBone._0_4_ = (uint)pcBone + 1) {
    paVar1 = ((this->super_LimitBoneWeightsTest).mMesh)->mBones[(uint)pcBone];
    for (weight.mVertexId = 0; weight.mVertexId < paVar1->mNumWeights;
        weight.mVertexId = weight.mVertexId + 1) {
      aVar2 = paVar1->mWeights[weight.mVertexId];
      fStack_30 = aVar2.mWeight;
      Assimp::LimitBoneWeightsProcess::Weight::Weight
                ((Weight *)((long)&gtest_ar.message_.ptr_ + 4),(uint)pcBone,fStack_30);
      std::
      vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
      ::push_back(pvVar10 + ((ulong)aVar2 & 0xffffffff),
                  (value_type *)((long)&gtest_ar.message_.ptr_ + 4));
    }
  }
  for (gtest_ar.message_.ptr_._0_4_ = 0;
      (uint)gtest_ar.message_.ptr_ < ((this->super_LimitBoneWeightsTest).mMesh)->mNumVertices;
      gtest_ar.message_.ptr_._0_4_ = (uint)gtest_ar.message_.ptr_ + 1) {
    local_58 = std::
               vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
               ::size(pvVar10 + (uint)gtest_ar.message_.ptr_);
    local_5c = 4;
    testing::internal::CmpHelperLE<unsigned_long,unsigned_int>
              ((internal *)local_50,"asWeights[i].size()","4U",&local_58,&local_5c);
    bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
    if (!bVar4) {
      testing::Message::Message(local_78);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utLimitBoneWeights.cpp"
                 ,0x7d,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff80,local_78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff80);
      testing::Message::~Message(local_78);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
    iter._M_current._4_4_ = 0.0;
    local_98._M_current =
         (Weight *)
         std::
         vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
         ::begin(pvVar10 + (uint)gtest_ar.message_.ptr_);
    __gnu_cxx::
    __normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_const*,std::vector<Assimp::LimitBoneWeightsProcess::Weight,std::allocator<Assimp::LimitBoneWeightsProcess::Weight>>>
    ::__normal_iterator<Assimp::LimitBoneWeightsProcess::Weight*>
              ((__normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_const*,std::vector<Assimp::LimitBoneWeightsProcess::Weight,std::allocator<Assimp::LimitBoneWeightsProcess::Weight>>>
                *)&local_90,&local_98);
    while( true ) {
      gtest_ar_1.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
           ::end(pvVar10 + (uint)gtest_ar.message_.ptr_);
      bVar4 = __gnu_cxx::operator!=
                        (&local_90,
                         (__normal_iterator<Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
                          *)&gtest_ar_1.message_);
      if (!bVar4) break;
      pWVar9 = __gnu_cxx::
               __normal_iterator<const_Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
               ::operator*(&local_90);
      iter._M_current._4_4_ = pWVar9->mWeight + iter._M_current._4_4_;
      __gnu_cxx::
      __normal_iterator<const_Assimp::LimitBoneWeightsProcess::Weight_*,_std::vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>_>
      ::operator++(&local_90);
    }
    local_b4 = 0.95;
    testing::internal::CmpHelperGE<float,float>
              ((internal *)local_b0,"fSum","0.95F",(float *)((long)&iter._M_current + 4),&local_b4);
    bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
    if (!bVar4) {
      testing::Message::Message(&local_c0);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utLimitBoneWeights.cpp"
                 ,0x82,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
    local_dc = 1.04;
    testing::internal::CmpHelperLE<float,float>
              ((internal *)local_d8,"fSum","1.04F",(float *)((long)&iter._M_current + 4),&local_dc);
    bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
    if (!bVar4) {
      testing::Message::Message(&local_e8);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utLimitBoneWeights.cpp"
                 ,0x83,pcVar8);
      testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      testing::Message::~Message(&local_e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  }
  if (pvVar10 !=
      (vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
       *)0x0) {
    this_00 = pvVar10 + *puVar7;
    while (pvVar10 != this_00) {
      this_00 = this_00 + -1;
      std::
      vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
      ::~vector(this_00);
    }
    operator_delete__(puVar7);
  }
  return;
}

Assistant:

TEST_F(LimitBoneWeightsTest, testProcess) {
    // execute the step on the given data
    mProcess->ProcessMesh(mMesh);

    // check whether everything is ok ...
    typedef std::vector<LimitBoneWeightsProcess::Weight> VertexWeightList;
    VertexWeightList* asWeights = new VertexWeightList[mMesh->mNumVertices];

    for (unsigned int i = 0; i < mMesh->mNumVertices; ++i) {
        asWeights[i].reserve(4);
    }

    // sort back as per-vertex lists
    for (unsigned int i = 0; i < mMesh->mNumBones;++i) {
        aiBone& pcBone = **(mMesh->mBones+i);
        for (unsigned int q = 0; q < pcBone.mNumWeights;++q) {
            aiVertexWeight weight = pcBone.mWeights[q];
            asWeights[weight.mVertexId].push_back(LimitBoneWeightsProcess::Weight (i,weight.mWeight));
        }
    }

    // now validate the size of the lists and check whether all weights sum to 1.0f
    for (unsigned int i = 0; i < mMesh->mNumVertices;++i) {
        EXPECT_LE(asWeights[i].size(), 4U);
        float fSum = 0.0f;
        for (VertexWeightList::const_iterator iter =  asWeights[i].begin(); iter != asWeights[i].end();++iter) {
            fSum += (*iter).mWeight;
        }
        EXPECT_GE(fSum, 0.95F);
        EXPECT_LE(fSum, 1.04F);
    }

    // delete allocated storage
    delete[] asWeights;

    // everything seems to be OK
}